

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O2

void __thiscall
Js::WebAssemblyModule::AddTableImport
          (WebAssemblyModule *this,char16 *modName,uint32 modNameLen,char16 *importName,
          uint32 importNameLen)

{
  WasmImport *local_40;
  WasmImport *wi;
  
  wi._4_4_ = importNameLen;
  local_40 = (WasmImport *)new<Memory::ArenaAllocator>(0x20,this->m_alloc,0x35916e);
  local_40->kind = Function;
  *(undefined3 *)&local_40->field_0x1 = 0;
  local_40->modNameLen = 0;
  local_40->modName = (char16 *)0x0;
  *(undefined8 *)&local_40->importNameLen = 0;
  local_40->kind = Table;
  local_40->importName = importName;
  local_40->importNameLen = wi._4_4_;
  local_40->modName = modName;
  local_40->modNameLen = modNameLen;
  JsUtil::
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add((this->m_imports).ptr,&local_40);
  Memory::WriteBarrierPtr<Wasm::WasmImport>::WriteBarrierSet(&this->m_tableImport,local_40);
  return;
}

Assistant:

void
WebAssemblyModule::AddTableImport(const char16* modName, uint32 modNameLen, const char16* importName, uint32 importNameLen)
{
    Wasm::WasmImport* wi = Anew(m_alloc, Wasm::WasmImport);
    wi->kind = Wasm::ExternalKinds::Table;
    wi->importName = importName;
    wi->importNameLen = importNameLen;
    wi->modName = modName;
    wi->modNameLen = modNameLen;
    m_imports->Add(wi);
    m_tableImport = wi;
}